

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O1

int Acb_ObjComputeLevelD(Acb_Ntk_t *p,int iObj)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  if (iObj < 1) {
    __assert_fail("i>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                  ,0xfe,"int Acb_ObjFanOffset(Acb_Ntk_t *, int)");
  }
  if ((p->vObjFans).nSize <= iObj) {
LAB_00382bc4:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar3 = (p->vObjFans).pArray[(uint)iObj];
  lVar4 = (long)iVar3;
  if ((lVar4 < 0) || ((p->vFanSto).nSize <= iVar3)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
  piVar2 = (p->vFanSto).pArray;
  lVar5 = (long)piVar2[lVar4];
  if (lVar5 < 1) {
    iVar3 = 0;
  }
  else {
    lVar6 = 0;
    iVar3 = 0;
    do {
      iVar1 = piVar2[lVar4 + lVar6 + 1];
      if ((long)iVar1 < 1) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                      ,0x113,"int Acb_ObjLevelD(Acb_Ntk_t *, int)");
      }
      if ((p->vLevelD).nSize <= iVar1) goto LAB_00382bc4;
      lVar6 = lVar6 + 1;
      iVar1 = (p->vLevelD).pArray[iVar1];
      if (iVar3 <= iVar1) {
        iVar3 = iVar1;
      }
    } while (lVar5 != lVar6);
  }
  if ((p->vObjType).nSize <= iObj) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                  ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
  }
  if ((p->vLevelD).nSize <= iObj) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  iVar3 = iVar3 + (uint)((byte)((p->vObjType).pArray[(uint)iObj] - 5U) < 0xfe);
  (p->vLevelD).pArray[(uint)iObj] = iVar3;
  return iVar3;
}

Assistant:

int Acb_ObjComputeLevelD( Acb_Ntk_t * p, int iObj )
{
    int * pFanins, iFanin, k, Level = 0;
    Acb_ObjForEachFaninFast( p, iObj, pFanins, iFanin, k )
        Level = Abc_MaxInt( Level, Acb_ObjLevelD(p, iFanin) );
    return Acb_ObjSetLevelD( p, iObj, Level + !Acb_ObjIsCio(p, iObj) );
}